

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O3

XXH_INLINE_XXH128_hash_t
XXH3_hashLong_128b_internal(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize)

{
  XXH64_hash_t XVar1;
  XXH3_accWidth_e in_R9D;
  XXH_INLINE_XXH128_hash_t XVar2;
  xxh_u64 acc [8];
  xxh_u64 local_c0 [19];
  
  local_c0[0] = 0xc2b2ae3d;
  local_c0[1] = 0x9e3779b185ebca87;
  local_c0[2] = 0xc2b2ae3d27d4eb4f;
  local_c0[3] = 0x165667b19e3779f9;
  local_c0[4] = 0x85ebca77c2b2ae63;
  local_c0[5] = 0x85ebca77;
  local_c0[6] = 0x27d4eb2f165667c5;
  local_c0[7] = 0x9e3779b1;
  XXH3_hashLong_internal_loop(local_c0,input,len,secret,1,in_R9D);
  XVar2.low64 = XXH3_mergeAccs(local_c0,secret + 0xb,len * -0x61c8864e7a143579);
  XVar1 = XXH3_mergeAccs(local_c0,secret + 0x75,~(len * -0x3d4d51c2d82b14b1));
  XVar2.high64 = XVar1;
  return XVar2;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_hashLong_128b_internal(const xxh_u8* XXH_RESTRICT input, size_t len,
                            const xxh_u8* XXH_RESTRICT secret, size_t secretSize)
{
    XXH_ALIGN(XXH_ACC_ALIGN) xxh_u64 acc[ACC_NB] = XXH3_INIT_ACC;

    XXH3_hashLong_internal_loop(acc, input, len, secret, secretSize, XXH3_acc_128bits);

    /* converge into final hash */
    XXH_STATIC_ASSERT(sizeof(acc) == 64);
    XXH_ASSERT(secretSize >= sizeof(acc) + XXH_SECRET_MERGEACCS_START);
    {   xxh_u64 const low64 = XXH3_mergeAccs(acc, secret + XXH_SECRET_MERGEACCS_START, (xxh_u64)len * PRIME64_1);
        xxh_u64 const high64 = XXH3_mergeAccs(acc, secret + secretSize - sizeof(acc) - XXH_SECRET_MERGEACCS_START, ~((xxh_u64)len * PRIME64_2));
        XXH128_hash_t const h128 = { low64, high64 };
        return h128;
    }
}